

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinSop.c
# Opt level: O2

void Min_SopMinimize(Min_Man_t *p)

{
  int iVar1;
  Min_Cube_t **ppMVar2;
  int iVar3;
  Min_Cube_t *pMVar4;
  sbyte sVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  Min_Cube_t *pMVar9;
  Min_Man_t *p_00;
  uint uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  Min_Cube_t *pCube1;
  Min_Cube_t *pMVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  int local_60;
  int Var0;
  Min_Man_t *local_58;
  uint local_50;
  uint local_4c;
  long local_48;
  long local_40;
  int local_38;
  int local_34;
  
  iVar3 = p->nCubes;
  if (iVar3 < 3) {
    return;
  }
  pMVar4 = p->pBubble;
  local_58 = p;
LAB_003a4202:
  ppMVar2 = p->ppStore;
  pMVar4->pNext = *ppMVar2;
  *ppMVar2 = pMVar4;
  *(uint *)&pMVar4->field_0x8 = *(uint *)&pMVar4->field_0x8 & 0x3fffff;
  local_38 = iVar3;
LAB_003a421a:
  pMVar4 = p->pBubble;
  uVar16 = *(uint *)&pMVar4->field_0x8 >> 0x16;
  uVar18 = (ulong)uVar16;
  pMVar15 = (Min_Cube_t *)((ulong)(uVar16 * 8) + (long)p->ppStore);
  do {
    pMVar9 = pMVar15;
    pMVar15 = pMVar9->pNext;
    if (pMVar15 == (Min_Cube_t *)0x0) break;
  } while (pMVar15 != pMVar4);
  if (pMVar15 != pMVar4) {
    __assert_fail("pCube == p->pBubble",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                  ,0x6c,"void Min_SopRewrite(Min_Man_t *)");
  }
  pMVar9->pNext = pMVar4->pNext;
  pMVar4 = p->pBubble;
  pMVar15 = pMVar4->pNext;
  pCube1 = pMVar15;
  if (pMVar15 == (Min_Cube_t *)0x0) {
    uVar8 = (ulong)(uVar16 * 8);
    do {
      if ((long)p->nVars <= (long)uVar18) {
        iVar3 = p->nCubes;
        if (((double)(local_38 - iVar3) * 100.0) / (double)local_38 <= 3.0) {
          return;
        }
        goto LAB_003a4202;
      }
      uVar18 = uVar18 + 1;
      pMVar15 = *(Min_Cube_t **)((long)p->ppStore + uVar8 + 8);
      uVar8 = uVar8 + 8;
    } while (pMVar15 == (Min_Cube_t *)0x0);
    pMVar9 = (Min_Cube_t *)((long)p->ppStore + uVar8);
    pCube1 = pMVar15;
  }
  do {
    pMVar4 = pCube1;
    pCube1 = pMVar4->pNext;
    if (pCube1 == (Min_Cube_t *)0x0) {
      if (p->nVars <= (int)uVar18) goto LAB_003a44e2;
      pCube1 = (Min_Cube_t *)(p->ppStore + (long)(int)uVar18 + 1);
      goto LAB_003a42cd;
    }
    iVar3 = Min_CubesDistTwo(pMVar15,pCube1,&Var0,&local_60);
  } while (iVar3 == 0);
  goto LAB_003a42f6;
  while (iVar3 = Min_CubesDistTwo(pMVar15,pCube1,&Var0,&local_60), iVar3 == 0) {
LAB_003a42cd:
    pMVar4 = pCube1;
    pCube1 = pMVar4->pNext;
    if (pCube1 == (Min_Cube_t *)0x0) goto LAB_003a44e2;
  }
LAB_003a42f6:
  p_00 = local_58;
  iVar3 = Var0;
  pMVar4->pNext = pCube1->pNext;
  pMVar4 = p->pBubble;
  pMVar9->pNext = pMVar4;
  pMVar4->pNext = pMVar15->pNext;
  *(uint *)&pMVar4->field_0x8 =
       *(uint *)&pMVar4->field_0x8 & 0x3fffff | *(uint *)&pMVar15->field_0x8 & 0xffc00000;
  p->nCubes = p->nCubes + -2;
  if ((pMVar15 == p->pBubble) || (pCube1 == p->pBubble)) {
    __assert_fail("pCube != p->pBubble && pThis != p->pBubble",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                  ,0x9b,"void Min_SopRewrite(Min_Man_t *)");
  }
  lVar12 = (long)(Var0 >> 4);
  uVar16 = pMVar15->uData[lVar12];
  uVar14 = Var0 * 2 & 0x1e;
  sVar5 = (sbyte)uVar14;
  lVar13 = (long)(local_60 >> 4);
  bVar6 = (char)local_60 * '\x02' & 0x1e;
  uVar17 = uVar16 >> sVar5 & 3;
  uVar11 = pCube1->uData[lVar12] >> sVar5 & 3;
  if (uVar17 == uVar11) {
LAB_003a489d:
    __assert_fail("v00 != v10 && v01 != v11",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                  ,0xa3,"void Min_SopRewrite(Min_Man_t *)");
  }
  uVar19 = pMVar15->uData[lVar13] >> bVar6 & 3;
  uVar10 = pCube1->uData[lVar13] >> bVar6 & 3;
  if (uVar19 == uVar10) goto LAB_003a489d;
  if ((uVar17 == 3) && (uVar19 == 3)) {
    __assert_fail("v00 != 3 || v01 != 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                  ,0xa4,"void Min_SopRewrite(Min_Man_t *)");
  }
  if ((uVar11 == 3) && (uVar10 == 3)) {
    __assert_fail("v10 != 3 || v11 != 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                  ,0xa5,"void Min_SopRewrite(Min_Man_t *)");
  }
  pMVar4 = pCube1;
  if (((uVar11 != 3) && (uVar17 != 3 && uVar19 != 3)) && (uVar10 != 3)) {
    if ((uVar11 ^ uVar17) != 3) {
      __assert_fail("v00 == (v10 ^ 3)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                    ,0xb2,"void Min_SopRewrite(Min_Man_t *)");
    }
    local_40 = lVar13;
    if ((uVar10 ^ uVar19) != 3) {
      __assert_fail("v01 == (v11 ^ 3)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                    ,0xb3,"void Min_SopRewrite(Min_Man_t *)");
    }
    pMVar15->uData[lVar12] = 3 << sVar5 ^ uVar16;
    local_50 = uVar16;
    local_4c = uVar14;
    local_34 = Min_CoverContainsCube(local_58,pMVar15);
    lVar13 = local_40;
    pMVar15->uData[lVar12] = local_50;
    local_50 = pMVar15->uData[local_40];
    pMVar15->uData[local_40] = 3 << bVar6 ^ local_50;
    local_48 = lVar12;
    iVar3 = Min_CoverContainsCube(local_58,pMVar15);
    p_00 = local_58;
    pMVar15->uData[lVar13] = local_50;
    if (iVar3 == 0 || local_34 == 0) {
      bVar7 = (byte)local_4c;
      if (local_34 == 0) {
        if (iVar3 == 0) {
          Min_SopAddCube(local_58,pMVar15);
        }
        else {
          pMVar15->uData[local_40] = local_50 ^ (uVar19 ^ 3) << bVar6;
          *(int *)&pMVar15->field_0x8 = *(int *)&pMVar15->field_0x8 + -0x400000;
          Min_SopAddCube(local_58,pMVar15);
          pCube1->uData[local_48] = pCube1->uData[local_48] ^ uVar17 << (bVar7 & 0x1f);
          *(int *)&pCube1->field_0x8 = *(int *)&pCube1->field_0x8 + -0x400000;
        }
      }
      else {
        pMVar15->uData[local_48] = pMVar15->uData[local_48] ^ (uVar17 ^ 3) << (bVar7 & 0x1f);
        *(int *)&pMVar15->field_0x8 = *(int *)&pMVar15->field_0x8 + -0x400000;
        Min_SopAddCube(local_58,pMVar15);
        pCube1->uData[local_40] = pCube1->uData[local_40] ^ uVar19 << bVar6;
        *(int *)&pCube1->field_0x8 = *(int *)&pCube1->field_0x8 + -0x400000;
      }
    }
    else {
      Min_CubeRecycle(local_58,pCube1);
      pMVar15->uData[local_48] = pMVar15->uData[local_48] ^ (uVar17 ^ 3) << ((byte)local_4c & 0x1f);
      pMVar15->uData[lVar13] = pMVar15->uData[lVar13] ^ (uVar19 ^ 3) << bVar6;
      *(int *)&pMVar15->field_0x8 = *(int *)&pMVar15->field_0x8 + -0x800000;
      pMVar4 = pMVar15;
    }
    goto LAB_003a4817;
  }
  pMVar9 = pMVar15;
  uVar16 = uVar11;
  uVar14 = uVar10;
  if (((uVar17 != 3 && uVar19 != 3) &&
      (pMVar4 = pMVar15, pMVar9 = pCube1, uVar16 = uVar17, uVar14 = uVar19, uVar17 = uVar11,
      uVar19 = uVar10, uVar11 != 3)) && (uVar10 != 3)) {
    __assert_fail("v10 == 3 || v11 == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                  ,0xee,"void Min_SopRewrite(Min_Man_t *)");
  }
  uVar11 = uVar14;
  if (uVar17 != 3) {
    if (uVar19 != 3) {
      __assert_fail("v01 == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                    ,0xf7,"void Min_SopRewrite(Min_Man_t *)");
    }
    Var0 = local_60;
    local_60 = iVar3;
    uVar11 = uVar16;
    uVar19 = uVar17;
    uVar16 = uVar14;
  }
  if (uVar11 == 3) {
    if (uVar16 == 3 || uVar19 == 3) {
      __assert_fail("v01 != 3 && v10 != 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                    ,0x100,"void Min_SopRewrite(Min_Man_t *)");
    }
    pMVar9->uData[Var0 >> 4] = pMVar9->uData[Var0 >> 4] ^ uVar16 << ((char)Var0 * '\x02' & 0x1fU);
    pMVar9->uData[local_60 >> 4] =
         pMVar9->uData[local_60 >> 4] ^ 3 << ((char)local_60 * '\x02' & 0x1fU);
    *(int *)&pMVar9->field_0x8 = *(int *)&pMVar9->field_0x8 + 0x400000;
    iVar3 = Min_CoverContainsCube(local_58,pMVar9);
    pMVar9->uData[Var0 >> 4] = pMVar9->uData[Var0 >> 4] ^ uVar16 << ((char)Var0 * '\x02' & 0x1fU);
    pMVar9->uData[local_60 >> 4] =
         pMVar9->uData[local_60 >> 4] ^ 3 << ((char)local_60 * '\x02' & 0x1fU);
    *(int *)&pMVar9->field_0x8 = *(int *)&pMVar9->field_0x8 + -0x400000;
    if (iVar3 == 0) {
      pMVar9->uData[Var0 >> 4] = pMVar9->uData[Var0 >> 4] ^ uVar16 << ((char)Var0 * '\x02' & 0x1fU);
      *(int *)&pMVar9->field_0x8 = *(int *)&pMVar9->field_0x8 + 0x400000;
      iVar3 = p_00->nCubes;
      Min_SopAddCube(p_00,pMVar9);
      iVar1 = p_00->nCubes;
      if (iVar1 <= iVar3) goto LAB_003a4817;
      uVar17 = *(uint *)&pMVar9->field_0x8 >> 0x16;
      if (pMVar9 != p_00->ppStore[uVar17]) {
        __assert_fail("pCube == p->ppStore[pCube->nLits]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                      ,0x125,"void Min_SopRewrite(Min_Man_t *)");
      }
      p_00->ppStore[uVar17] = pMVar9->pNext;
      p_00->nCubes = iVar1 + -1;
      pMVar9->uData[Var0 >> 4] = pMVar9->uData[Var0 >> 4] ^ uVar16 << ((char)Var0 * '\x02' & 0x1fU);
      *(int *)&pMVar9->field_0x8 = *(int *)&pMVar9->field_0x8 + -0x400000;
      pMVar4->uData[local_60 >> 4] =
           pMVar4->uData[local_60 >> 4] ^ uVar19 << ((char)local_60 * '\x02' & 0x1fU);
      *(int *)&pMVar4->field_0x8 = *(int *)&pMVar4->field_0x8 + 0x400000;
LAB_003a47a4:
      Min_SopAddCube(p_00,pMVar9);
      goto LAB_003a4817;
    }
  }
  else {
    if (uVar16 == 3 || uVar19 == 3) {
      __assert_fail("v01 != 3 && v10 != 3 && v11 != 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                    ,0x139,"void Min_SopRewrite(Min_Man_t *)");
    }
    pMVar4->uData[Var0 >> 4] = pMVar4->uData[Var0 >> 4] ^ 3 << ((char)Var0 * '\x02' & 0x1fU);
    iVar3 = Min_CoverContainsCube(local_58,pMVar4);
    pMVar4->uData[Var0 >> 4] = pMVar4->uData[Var0 >> 4] ^ 3 << ((char)Var0 * '\x02' & 0x1fU);
    if (iVar3 == 0) {
      pMVar9->uData[Var0 >> 4] = pMVar9->uData[Var0 >> 4] ^ uVar16 << ((char)Var0 * '\x02' & 0x1fU);
      *(int *)&pMVar9->field_0x8 = *(int *)&pMVar9->field_0x8 + 0x400000;
      pMVar4->uData[local_60 >> 4] =
           pMVar4->uData[local_60 >> 4] ^ (uVar11 ^ 3) << ((char)local_60 * '\x02' & 0x1fU);
      *(int *)&pMVar4->field_0x8 = *(int *)&pMVar4->field_0x8 + -0x400000;
      goto LAB_003a47a4;
    }
  }
  Min_CubeRecycle(p_00,pMVar4);
  pMVar9->uData[local_60 >> 4] =
       pMVar9->uData[local_60 >> 4] ^ (uVar19 ^ 3) << ((char)local_60 * '\x02' & 0x1fU);
  *(int *)&pMVar9->field_0x8 = *(int *)&pMVar9->field_0x8 + -0x400000;
  pMVar4 = pMVar9;
LAB_003a4817:
  Min_SopAddCube(p_00,pMVar4);
  p = p_00;
  goto LAB_003a421a;
LAB_003a44e2:
  pMVar4 = p->pBubble;
  pMVar4->pNext = pMVar15->pNext;
  pMVar15->pNext = pMVar4;
  *(uint *)&pMVar4->field_0x8 =
       *(uint *)&pMVar4->field_0x8 & 0x3fffff | *(uint *)&pMVar15->field_0x8 & 0xffc00000;
  goto LAB_003a421a;
}

Assistant:

void Min_SopMinimize( Min_Man_t * p )
{
    int nCubesInit, nCubesOld, nIter;
    if ( p->nCubes < 3 )
        return;
    nIter = 0;
    nCubesInit = p->nCubes;
    do {
        nCubesOld = p->nCubes;
        Min_SopRewrite( p );
        nIter++;
//    printf( "%d:%d->%d ", nIter, nCubesInit, p->nCubes );
    }
    while ( 100.0*(nCubesOld - p->nCubes)/nCubesOld > 3.0 );
//    printf( "\n" );

}